

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O2

void __thiscall SymbolData::startFunction(SymbolData *this,int64_t address)

{
  pointer pSVar1;
  vector<SymDataFunction,_std::allocator<SymDataFunction>_> *this_00;
  SymDataFunction func;
  value_type local_20;
  
  if (this->currentFunction != -1) {
    endFunction(this,address);
  }
  pSVar1 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl
           .super__Vector_impl_data._M_start;
  this_00 = &pSVar1[this->currentModule].functions;
  this->currentFunction =
       (int)((ulong)((long)*(pointer *)
                            ((long)&pSVar1[this->currentModule].functions.
                                    super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>
                                    ._M_impl + 8) -
                    (long)(this_00->
                          super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 4);
  local_20.size = 0;
  local_20.address = address;
  std::vector<SymDataFunction,_std::allocator<SymDataFunction>_>::push_back(this_00,&local_20);
  return;
}

Assistant:

void SymbolData::startFunction(int64_t address)
{
	if (currentFunction != -1)
	{
		endFunction(address);
	}

	currentFunction = (int)modules[currentModule].functions.size();

	SymDataFunction func;
	func.address = address;
	func.size = 0;
	modules[currentModule].functions.push_back(func);
}